

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain_tests.cpp
# Opt level: O2

void TestDifficulty(uint32_t nbits,double expected_difficulty)

{
  double dVar1;
  CBlockIndex *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  char *local_138;
  char *local_130;
  lazy_ostream local_128;
  undefined1 *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  assertion_result local_108;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  double local_d0;
  double local_c8;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this = (CBlockIndex *)operator_new(0x98);
  memset(this,0,0x98);
  CBlockIndex::CBlockIndex(this);
  this->nHeight = 0xb51f;
  this->nTime = 0x4ba6a133;
  this->nBits = nbits;
  dVar1 = GetDifficulty(this);
  operator_delete(this,0x98);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x27;
  file.m_begin = (iterator)&local_e0;
  local_d0 = expected_difficulty;
  local_c8 = dVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(ABS(dVar1 - expected_difficulty) < 1e-05);
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  util::ToString<double>(&local_a0,&local_c8);
  std::operator+(&local_80,"Difficulty was ",&local_a0);
  std::operator+(&local_60,&local_80," but was expected to be ");
  util::ToString<double>(&local_c0,&local_d0);
  std::operator+(&local_40,&local_60,&local_c0);
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139e30;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
  ;
  local_130 = "";
  local_110 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,&local_128,1,1,WARN,(check_type)expected_difficulty,(size_t)&local_138,0x27)
  ;
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TestDifficulty(uint32_t nbits, double expected_difficulty)
{
    CBlockIndex* block_index = CreateBlockIndexWithNbits(nbits);
    double difficulty = GetDifficulty(*block_index);
    delete block_index;

    RejectDifficultyMismatch(difficulty, expected_difficulty);
}